

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionEndStr.cpp
# Opt level: O2

void __thiscall
Hpipe::InstructionEndStr::write_dot
          (InstructionEndStr *this,ostream *os,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *edge_labels)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<(os,"END_STR(");
  poVar1 = std::operator<<(poVar1,(string *)&this->var);
  poVar1 = std::operator<<(poVar1,",");
  poVar1 = std::ostream::_M_insert<bool>(SUB81(poVar1,0));
  std::operator<<(poVar1,")");
  return;
}

Assistant:

void InstructionEndStr::write_dot( std::ostream &os, std::vector<std::string> *edge_labels ) const {
    os << "END_STR(" << var << "," << want_next_char << ")";
}